

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O2

shared_ptr<duckdb::CSVStateMachineCache,_true> __thiscall
duckdb::ObjectCache::GetOrCreate<duckdb::CSVStateMachineCache>(ObjectCache *this,string *key)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  iterator iVar2;
  ObjectCacheEntry *pOVar3;
  mapped_type *this_00;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::CSVStateMachineCache,_true> sVar4;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  __shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __mutex = (pthread_mutex_t *)((long)&key[1].field_2 + 8);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)key,in_RDX);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    make_shared_ptr<duckdb::CSVStateMachineCache>();
    this_00 = ::std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)key,in_RDX);
    shared_ptr<duckdb::ObjectCacheEntry,_true>::operator=<duckdb::CSVStateMachineCache,_0>
              (this_00,(shared_ptr<duckdb::CSVStateMachineCache,_true> *)this);
    goto LAB_019bc157;
  }
  ::std::__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             (__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
                    ._M_cur + 0x28));
  if (local_88._M_ptr == (element_type *)0x0) {
LAB_019bc0ff:
    (this->cache)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->cache)._M_h._M_bucket_count = 0;
  }
  else {
    pOVar3 = shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                       ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)&local_88);
    (*pOVar3->_vptr_ObjectCacheEntry[2])(&local_68,pOVar3);
    CSVStateMachineCache::ObjectType_abi_cxx11_();
    bVar1 = ::std::operator!=(&local_68,&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) goto LAB_019bc0ff;
    ::std::__shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,&local_88);
    shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::CSVStateMachineCache>
              ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)this);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
LAB_019bc157:
  pthread_mutex_unlock(__mutex);
  sVar4.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<duckdb::CSVStateMachineCache,_true>)
         sVar4.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<T> GetOrCreate(const string &key, ARGS &&... args) {
		lock_guard<mutex> glock(lock);

		auto entry = cache.find(key);
		if (entry == cache.end()) {
			auto value = make_shared_ptr<T>(args...);
			cache[key] = value;
			return value;
		}
		auto object = entry->second;
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}